

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&>::
DescribeNegationTo(ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *this,
                  ostream *os)

{
  size_t sVar1;
  MatcherBase<const_int_&> *this_00;
  ostream *poVar2;
  ostream *in_RSI;
  long in_RDI;
  size_t i;
  ostream *os_00;
  ulong local_30;
  Message *in_stack_ffffffffffffffd8;
  ostream *in_stack_ffffffffffffffe0;
  ostream local_18 [8];
  ostream *local_10;
  
  local_10 = in_RSI;
  sVar1 = count((ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *)0x9b517d);
  if (sVar1 == 0) {
    std::operator<<(local_10,"isn\'t empty");
  }
  else {
    std::operator<<(local_10,"doesn\'t have ");
    count((ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *)0x9b51b9);
    os_00 = local_18;
    Elements((size_t)in_stack_ffffffffffffffd8);
    this_00 = (MatcherBase<const_int_&> *)
              testing::operator<<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::operator<<((ostream *)this_00,", or\n");
    Message::~Message((Message *)0x9b51fe);
    local_30 = 0;
    while( true ) {
      sVar1 = count((ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *)
                    0x9b521b);
      if (local_30 == sVar1) break;
      poVar2 = std::operator<<(local_10,"element #");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
      std::operator<<(poVar2," ");
      std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
      operator[]((vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  *)(in_RDI + 8),local_30);
      MatcherBase<const_int_&>::DescribeNegationTo(this_00,os_00);
      sVar1 = count((ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *)
                    0x9b5291);
      if (local_30 + 1 < sVar1) {
        std::operator<<(local_10,", or\n");
      }
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "isn't empty";
      return;
    }

    *os << "doesn't have " << Elements(count()) << ", or\n";
    for (size_t i = 0; i != count(); ++i) {
      *os << "element #" << i << " ";
      matchers_[i].DescribeNegationTo(os);
      if (i + 1 < count()) {
        *os << ", or\n";
      }
    }
  }